

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testInit(LengthOfVectorAndMatrixTest *this)

{
  vector<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,_std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>_>
  *this_00;
  pointer *pptVar1;
  iterator iVar2;
  GLuint row;
  GLuint GVar3;
  uint uVar4;
  GLuint row_3;
  testCase test_case;
  testCase local_34;
  
  this_00 = &this->m_test_cases;
  GVar3 = 2;
  do {
    local_34.m_type = UINT;
    local_34.m_n_cols = 1;
    iVar2._M_current =
         (this->m_test_cases).
         super__Vector_base<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,_std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->m_test_cases).
        super__Vector_base<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,_std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_34.m_n_rows = GVar3;
      std::
      vector<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>>
      ::_M_realloc_insert<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase_const&>
                ((vector<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>>
                  *)this_00,iVar2,&local_34);
    }
    else {
      (iVar2._M_current)->m_n_rows = GVar3;
      (iVar2._M_current)->m_type = UINT;
      (iVar2._M_current)->m_n_cols = 1;
      pptVar1 = &(this->m_test_cases).
                 super__Vector_base<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,_std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pptVar1 = *pptVar1 + 1;
    }
    GVar3 = GVar3 + 1;
  } while (GVar3 != 5);
  GVar3 = 2;
  do {
    local_34.m_type = INT;
    local_34.m_n_cols = 1;
    iVar2._M_current =
         (this->m_test_cases).
         super__Vector_base<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,_std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->m_test_cases).
        super__Vector_base<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,_std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_34.m_n_rows = GVar3;
      std::
      vector<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>>
      ::_M_realloc_insert<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase_const&>
                ((vector<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>>
                  *)this_00,iVar2,&local_34);
    }
    else {
      (iVar2._M_current)->m_n_rows = GVar3;
      (iVar2._M_current)->m_type = INT;
      (iVar2._M_current)->m_n_cols = 1;
      pptVar1 = &(this->m_test_cases).
                 super__Vector_base<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,_std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pptVar1 = *pptVar1 + 1;
    }
    GVar3 = GVar3 + 1;
  } while (GVar3 != 5);
  GVar3 = 2;
  do {
    local_34.m_type = FLOAT;
    local_34.m_n_cols = 1;
    iVar2._M_current =
         (this->m_test_cases).
         super__Vector_base<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,_std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->m_test_cases).
        super__Vector_base<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,_std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_34.m_n_rows = GVar3;
      std::
      vector<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>>
      ::_M_realloc_insert<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase_const&>
                ((vector<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>>
                  *)this_00,iVar2,&local_34);
    }
    else {
      (iVar2._M_current)->m_n_rows = GVar3;
      (iVar2._M_current)->m_type = FLOAT;
      (iVar2._M_current)->m_n_cols = 1;
      pptVar1 = &(this->m_test_cases).
                 super__Vector_base<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,_std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pptVar1 = *pptVar1 + 1;
    }
    GVar3 = GVar3 + 1;
  } while (GVar3 != 5);
  uVar4 = 2;
  do {
    GVar3 = 2;
    do {
      local_34._0_8_ = (ulong)uVar4 << 0x20;
      iVar2._M_current =
           (this->m_test_cases).
           super__Vector_base<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,_std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->m_test_cases).
          super__Vector_base<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,_std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_34.m_n_rows = GVar3;
        std::
        vector<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>>
        ::_M_realloc_insert<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase_const&>
                  ((vector<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>>
                    *)this_00,iVar2,&local_34);
      }
      else {
        (iVar2._M_current)->m_n_rows = GVar3;
        (iVar2._M_current)->m_type = local_34.m_type;
        (iVar2._M_current)->m_n_cols = local_34.m_n_cols;
        pptVar1 = &(this->m_test_cases).
                   super__Vector_base<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,_std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pptVar1 = *pptVar1 + 1;
      }
      GVar3 = GVar3 + 1;
    } while (GVar3 != 5);
    uVar4 = uVar4 + 1;
  } while (uVar4 != 5);
  return true;
}

Assistant:

bool LengthOfVectorAndMatrixTest::testInit()
{
	/* Vectors */
	for (GLuint row = 2; row <= 4; ++row)
	{
		testCase test_case = { Utils::UINT, 1 /* n_cols */, row };

		m_test_cases.push_back(test_case);
	}

	for (GLuint row = 2; row <= 4; ++row)
	{
		testCase test_case = { Utils::INT, 1 /* n_cols */, row };

		m_test_cases.push_back(test_case);
	}

	for (GLuint row = 2; row <= 4; ++row)
	{
		testCase test_case = { Utils::FLOAT, 1 /* n_cols */, row };

		m_test_cases.push_back(test_case);
	}

	/* Matrices */
	for (GLuint col = 2; col <= 4; ++col)
	{
		for (GLuint row = 2; row <= 4; ++row)
		{
			testCase test_case = { Utils::FLOAT, col, row };

			m_test_cases.push_back(test_case);
		}
	}

	return true;
}